

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fColorClearTest.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::ColorClearCase::iterate(ColorClearCase *this)

{
  pointer *this_00;
  byte bVar1;
  uint width;
  RenderContext *context;
  TestContext *this_01;
  TestLog *pTVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  uint height;
  RGBA RVar10;
  undefined4 uVar11;
  RGBA c;
  undefined4 extraout_var;
  RenderTarget *pRVar12;
  size_t __n;
  Surface *pSVar13;
  ulong uVar14;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int opNdx;
  uint uVar15;
  IterateResult IVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  byte bVar22;
  int iVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  int x;
  long lVar27;
  size_t sVar28;
  bool bVar29;
  RGBA local_4fc;
  allocator<char> local_4d8;
  allocator<char> local_4d7;
  allocator<char> local_4d6;
  allocator<char> local_4d5;
  allocator<char> local_4d4;
  allocator<char> local_4d3;
  allocator<char> local_4d2;
  allocator<char> local_4d1;
  TestLog *local_4d0;
  uint local_4c4;
  uint local_4c0;
  uint local_4bc;
  int local_4b8;
  int local_4b4;
  uint local_4b0;
  uint local_4ac;
  Surface resImage;
  Surface refImage;
  Random rnd;
  vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  clearOps;
  string local_448;
  string local_428;
  Surface diffImage;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelKnownChannelMask;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  LogImageSet local_318;
  LogImage local_2d8;
  vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  scanlineClearOps;
  LogImage local_c0;
  
  local_4d0 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar24 = CONCAT44(extraout_var,iVar4);
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = pRVar12->m_width;
  height = pRVar12->m_height;
  uVar5 = ((uint)this->m_curIter >> 0x10 ^ this->m_curIter ^ 0x3d) * 9;
  uVar5 = (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d;
  deRandom_init(&rnd.m_rnd,uVar5 >> 0xf ^ uVar5);
  scanlineClearOps.
  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)scanlineClearOps.
                        super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pixelKnownChannelMask,(long)(int)(height * width),
             (value_type_conflict4 *)&scanlineClearOps,(allocator_type *)&local_2d8);
  tcu::Surface::Surface(&refImage,width,height);
  tcu::Surface::Surface(&resImage,width,height);
  tcu::Surface::Surface(&diffImage,width,height);
  dVar6 = deRandom_getUint32(&rnd.m_rnd);
  iVar4 = this->m_numClearsMin;
  local_4c4 = dVar6 % ((this->m_numClearsMax - iVar4) + 1U);
  clearOps.
  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clearOps.
  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clearOps.
  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_testScissoring == true) {
    (**(code **)(lVar24 + 0x5e0))(0xc11);
  }
  local_4c4 = local_4c4 + iVar4;
  local_4bc = width * 2;
  local_4c0 = height * 2;
  for (iVar4 = 0; iVar4 < (int)local_4c4; iVar4 = iVar4 + 1) {
    iVar26 = 0;
    uVar5 = width;
    uVar25 = height;
    if (this->m_testScissoring == true) {
      if ((iVar4 != 0) || (iVar23 = 0, iVar26 = 0, this->m_firstClearFull == false)) {
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        uVar5 = dVar6 % local_4bc;
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        uVar25 = dVar6 % local_4c0;
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        dVar7 = deRandom_getUint32(&rnd.m_rnd);
        iVar23 = uVar5 - width;
        iVar26 = uVar25 - height;
        uVar5 = dVar6 % width;
        uVar25 = dVar7 % height;
      }
    }
    else {
      iVar23 = 0;
    }
    local_4b0 = uVar25;
    local_4ac = uVar5;
    (**(code **)(lVar24 + 0x1290))(iVar23,iVar26,uVar5);
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    dVar7 = deRandom_getUint32(&rnd.m_rnd);
    local_4b8 = iVar23;
    local_4b4 = iVar26;
    dVar8 = deRandom_getUint32(&rnd.m_rnd);
    uVar5 = 0xff;
    if (this->m_testAlpha == true) {
      dVar9 = deRandom_getUint32(&rnd.m_rnd);
      uVar5 = dVar9 & 0xff;
    }
    (**(code **)(lVar24 + 0x1c0))
              ((float)(dVar6 & 0xff) / 255.0,(float)(dVar7 & 0xff) / 255.0,
               (float)(dVar8 & 0xff) / 255.0,(float)uVar5 / 255.0);
    uVar14 = 0xf;
    if ((this->m_testColorMasks == true) && ((iVar4 != 0 || (this->m_firstClearFull == false)))) {
      dVar9 = deRandom_getUint32(&rnd.m_rnd);
      uVar14 = (ulong)dVar9 & 0xffffffffffffff0f;
    }
    bVar22 = (byte)uVar14;
    (**(code **)(lVar24 + 0x238))(bVar22 & 1,(byte)(uVar14 >> 1) & 1,bVar22 >> 2 & 1);
    (**(code **)(lVar24 + 0x188))(0x4000);
    local_2d8.m_name._M_dataplus._M_p._0_4_ = local_4b8;
    local_2d8.m_name._M_dataplus._M_p._4_4_ = local_4b4;
    local_2d8.m_name._M_string_length._0_4_ = local_4ac;
    local_2d8.m_name._M_string_length._4_4_ = local_4b0;
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&scanlineClearOps,(Vector<int,_4> *)&local_2d8);
    scanlineClearOps.
    super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(scanlineClearOps.
                           super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,bVar22);
    scanlineClearOps.
    super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44((dVar8 & 0xff) << 0x10 | (dVar7 & 0xff) << 8 | uVar5 << 0x18 |
                           dVar6 & 0xff,
                           scanlineClearOps.
                           super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    std::
    vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ::emplace_back<deqp::gles3::Functional::ClearInfo>(&clearOps,(ClearInfo *)&scanlineClearOps);
    tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  }
  uVar5 = 0;
  if ((int)height < 1) {
    height = uVar5;
  }
  uVar25 = 0;
  do {
    if (uVar25 == height) {
      context = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)&scanlineClearOps,&resImage);
      glu::readPixels(context,0,0,(PixelBufferAccess *)&scanlineClearOps);
      dVar6 = (**(code **)(lVar24 + 0x800))();
      glu::checkError(dVar6,"glReadPixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fColorClearTest.cpp"
                      ,0xe9);
      local_4fc = tcu::PixelFormat::getColorThreshold(&pRVar12->m_pixelFormat);
      cVar3 = (**(code **)(lVar24 + 0xc70))(0xbd0);
      if (cVar3 != '\0') {
        uVar5 = local_4fc.m_value & 0xffffff00 | (local_4fc.m_value & 0xff) + 1;
        uVar5 = (uVar5 & 0xff00) + 0x100 | uVar5 & 0xffff00ff;
        local_4fc.m_value = ((uVar5 & 0xff0000) + 0x10000 | uVar5 & 0xff00ffff) + 0x1000000;
      }
      lVar24 = 0;
      uVar14 = (ulong)width;
      if ((int)width < 1) {
        uVar14 = 0;
      }
      bVar22 = 1;
      c.m_value = 0;
      __n = uVar14;
      for (uVar5 = 0; uVar5 != height; uVar5 = uVar5 + 1) {
        for (sVar28 = 0; uVar14 != sVar28; sVar28 = sVar28 + 1) {
          iVar4 = (int)sVar28;
          RVar10 = tcu::computeAbsDiffMasked
                             (*(deUint32 *)
                               ((long)refImage.m_pixels.m_ptr +
                               (long)(int)(refImage.m_width * uVar5 + iVar4) * 4),
                              *(deUint32 *)
                               ((long)resImage.m_pixels.m_ptr +
                               (long)(int)(resImage.m_width * uVar5 + iVar4) * 4),
                              (uint)pixelKnownChannelMask.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar4 + (int)lVar24]);
          scanlineClearOps.
          super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(scanlineClearOps.
                                 super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,RVar10.m_value);
          bVar29 = tcu::RGBA::isBelowThreshold((RGBA *)&scanlineClearOps,local_4fc);
          uVar11 = 0xff0000ff;
          if (bVar29) {
            uVar11 = 0xff00ff00;
          }
          __n = (size_t)(int)(diffImage.m_width * uVar5 + iVar4);
          *(undefined4 *)((long)diffImage.m_pixels.m_ptr + __n * 4) = uVar11;
          c = tcu::max(c,scanlineClearOps.
                         super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
          bVar22 = bVar22 & bVar29;
        }
        lVar24 = lVar24 + (ulong)width;
      }
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (bVar22 == 0) {
        tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Fail");
        scanlineClearOps.
        super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = &scanlineClearOps.
                   super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,"Image comparison failed, max diff = ");
        tcu::operator<<((ostream *)this_00,c);
        std::operator<<((ostream *)this_00,", threshold = ");
        tcu::operator<<((ostream *)this_00,local_4fc);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&scanlineClearOps,(EndMessageToken *)&tcu::TestLog::EndMessage)
        ;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"Result",&local_4d1)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_448,"Resulting framebuffer",&local_4d2);
        tcu::LogImageSet::LogImageSet(&local_318,&local_428,&local_448);
        tcu::LogImageSet::write(&local_318,(int)local_4d0,__buf_01,__n);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"Result",&local_4d3)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_398,"Resulting framebuffer",&local_4d4);
        pSVar13 = &resImage;
        tcu::LogImage::LogImage
                  ((LogImage *)&scanlineClearOps,&local_378,&local_398,pSVar13,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&scanlineClearOps,(int)local_4d0,__buf_02,(size_t)pSVar13);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b8,"Reference",&local_4d5);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d8,"Reference image",&local_4d6);
        pSVar13 = &refImage;
        tcu::LogImage::LogImage
                  (&local_2d8,&local_3b8,&local_3d8,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_2d8,(int)local_4d0,__buf_03,(size_t)pSVar13);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_338,"DiffMask",&local_4d7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_358,"Failing pixels",&local_4d8);
        pSVar13 = &diffImage;
        tcu::LogImage::LogImage
                  (&local_c0,&local_338,&local_358,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar2 = local_4d0;
        tcu::LogImage::write(&local_c0,(int)local_4d0,__buf_04,(size_t)pSVar13);
        tcu::TestLog::endImageSet(pTVar2);
        tcu::LogImage::~LogImage(&local_c0);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_338);
        tcu::LogImage::~LogImage(&local_2d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3b8);
        tcu::LogImage::~LogImage((LogImage *)&scanlineClearOps);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_378);
        tcu::LogImageSet::~LogImageSet(&local_318);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_428);
        IVar16 = STOP;
      }
      else {
        tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,"Pass");
        iVar4 = this->m_numIters;
        iVar26 = this->m_curIter + 1;
        this->m_curIter = iVar26;
        if (iVar26 == iVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"Result",(allocator<char> *)&local_378);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,"Resulting framebuffer",(allocator<char> *)&local_398);
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&local_2d8,&local_c0.m_name,&local_318.m_name);
          tcu::LogImageSet::write((LogImageSet *)&local_2d8,(int)local_4d0,__buf,__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"Result",(allocator<char> *)&local_3b8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_448,"Resulting framebuffer",(allocator<char> *)&local_3d8);
          pSVar13 = &resImage;
          tcu::LogImage::LogImage
                    ((LogImage *)&scanlineClearOps,&local_428,&local_448,pSVar13,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          pTVar2 = local_4d0;
          tcu::LogImage::write
                    ((LogImage *)&scanlineClearOps,(int)local_4d0,__buf_00,(size_t)pSVar13);
          tcu::TestLog::endImageSet(pTVar2);
          tcu::LogImage::~LogImage((LogImage *)&scanlineClearOps);
          std::__cxx11::string::~string((string *)&local_448);
          std::__cxx11::string::~string((string *)&local_428);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        IVar16 = (IterateResult)(iVar26 != iVar4);
      }
      std::
      _Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
      ::~_Vector_base(&clearOps.
                       super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                     );
      tcu::Surface::~Surface(&diffImage);
      tcu::Surface::~Surface(&resImage);
      tcu::Surface::~Surface(&refImage);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&pixelKnownChannelMask.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return IVar16;
    }
    scanlineClearOps.
    super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanlineClearOps.
    super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanlineClearOps.
    super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar27 = 0;
    for (lVar17 = 0;
        lVar17 < (int)(((long)clearOps.
                              super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)clearOps.
                             super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); lVar17 = lVar17 + 1
        ) {
      iVar4 = *(int *)((long)((clearOps.
                               super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_rect).m_data +
                      lVar27 + 4);
      if ((iVar4 <= (int)uVar25) &&
         ((int)uVar25 <
          iVar4 + *(int *)((long)((clearOps.
                                   super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_rect).m_data +
                          lVar27 + 0xc))) {
        std::
        vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
        ::push_back(&scanlineClearOps,
                    (value_type *)
                    ((long)((clearOps.
                             super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_rect).m_data + lVar27));
      }
      lVar27 = lVar27 + 0x18;
    }
    for (iVar4 = 0; width - iVar4 != 0 && iVar4 <= (int)width; iVar4 = iVar4 + uVar19) {
      uVar14 = ((long)scanlineClearOps.
                      super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)scanlineClearOps.
                     super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff;
      uVar21 = 0;
      bVar22 = 0;
      uVar19 = width - iVar4;
      do {
        while( true ) {
          uVar14 = uVar14 - 1;
          if ((int)uVar14 < 0) goto LAB_0067b0a1;
          uVar20 = uVar14 & 0xffffffff;
          iVar26 = scanlineClearOps.
                   super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar20].m_rect.m_data[0];
          if ((iVar26 <= iVar4) &&
             (iVar23 = scanlineClearOps.
                       super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar20].m_rect.m_data[2] + iVar26,
             uVar18 = iVar23 - iVar4, uVar18 != 0 && iVar4 <= iVar23)) break;
LAB_0067afe3:
          uVar18 = iVar26 - iVar4;
          if ((uVar18 != 0 && iVar4 <= iVar26) && ((int)uVar18 <= (int)uVar19)) {
            uVar19 = uVar18;
          }
        }
        iVar23 = scanlineClearOps.
                 super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20].m_rect.m_data[1];
        if (((int)uVar25 < iVar23) ||
           (iVar23 + scanlineClearOps.
                     super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar20].m_rect.m_data[3] <=
            (int)uVar25)) goto LAB_0067afe3;
        if ((int)uVar19 < (int)uVar18) {
          uVar18 = uVar19;
        }
        uVar19 = scanlineClearOps.
                 super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20].m_color.m_value;
        uVar15 = uVar21 & 0xffffff00 | uVar19 & 0xff;
        if ((bVar22 & 1) != 0) {
          uVar15 = uVar21;
        }
        bVar1 = scanlineClearOps.
                super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar20].m_colorMask;
        if ((bVar1 & 1) == 0) {
          uVar15 = uVar21;
        }
        uVar21 = uVar15 & 0xffff00ff | uVar19 & 0xff00;
        if ((bVar22 & 2) != 0) {
          uVar21 = uVar15;
        }
        if ((bVar1 & 2) == 0) {
          uVar21 = uVar15;
        }
        uVar15 = uVar21 & 0xff00ffff | uVar19 & 0xff0000;
        if ((bVar22 & 4) != 0) {
          uVar15 = uVar21;
        }
        if ((bVar1 & 4) == 0) {
          uVar15 = uVar21;
        }
        uVar21 = uVar15 & 0xffffff | uVar19 & 0xff000000;
        if ((bVar22 & 8) != 0) {
          uVar21 = uVar15;
        }
        if ((bVar1 & 8) == 0) {
          uVar21 = uVar15;
        }
        bVar22 = bVar1 | bVar22;
        uVar19 = uVar18;
      } while (bVar22 != 0xf);
      bVar22 = 0xf;
LAB_0067b0a1:
      uVar18 = uVar21 | 0xff000000;
      if ((pRVar12->m_pixelFormat).alphaBits != 0) {
        uVar18 = uVar21;
      }
      uVar14 = 0;
      iVar26 = iVar4;
      if (0 < (int)uVar19) {
        uVar14 = (ulong)uVar19;
      }
      while (bVar29 = uVar14 != 0, uVar14 = uVar14 - 1, bVar29) {
        *(uint *)((long)refImage.m_pixels.m_ptr +
                 (long)(int)(refImage.m_width * uVar25 + iVar26) * 4) = uVar18;
        pixelKnownChannelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start[(int)(uVar5 + iVar26)] =
             pixelKnownChannelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)(uVar5 + iVar26)] | bVar22;
        iVar26 = iVar26 + 1;
      }
    }
    std::
    _Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ::~_Vector_base(&scanlineClearOps.
                     super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                   );
    uVar25 = uVar25 + 1;
    uVar5 = uVar5 + width;
  } while( true );
}

Assistant:

TestCase::IterateResult ColorClearCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const glw::Functions&		gl						= m_context.getRenderContext().getFunctions();
	const tcu::RenderTarget&	renderTarget			= m_context.getRenderTarget();
	const tcu::PixelFormat&		pixelFormat				= renderTarget.getPixelFormat();
	const int					targetWidth				= renderTarget.getWidth();
	const int					targetHeight			= renderTarget.getHeight();
	const int					numPixels				= targetWidth * targetHeight;

	de::Random					rnd						(deInt32Hash(m_curIter));
	vector<deUint8>				pixelKnownChannelMask	(numPixels, 0);
	Surface						refImage				(targetWidth, targetHeight);
	Surface						resImage				(targetWidth, targetHeight);
	Surface						diffImage				(targetWidth, targetHeight);
	int							numClears				= rnd.getUint32() % (m_numClearsMax + 1 - m_numClearsMin) + m_numClearsMin;
	std::vector<ClearInfo>		clearOps;

	if (m_testScissoring)
		gl.enable(GL_SCISSOR_TEST);

	for (int clearNdx = 0; clearNdx < numClears; clearNdx++)
	{
		// Rectangle.
		int clearX;
		int clearY;
		int clearWidth;
		int clearHeight;
		if (!m_testScissoring || (clearNdx == 0 && m_firstClearFull))
		{
			clearX		= 0;
			clearY		= 0;
			clearWidth	= targetWidth;
			clearHeight	= targetHeight;
		}
		else
		{
			clearX		= (rnd.getUint32() % (2*targetWidth)) - targetWidth;
			clearY		= (rnd.getUint32() % (2*targetHeight)) - targetHeight;
			clearWidth	= (rnd.getUint32() % targetWidth);
			clearHeight	= (rnd.getUint32() % targetHeight);
		}
		gl.scissor(clearX, clearY, clearWidth, clearHeight);

		// Color.
		int		r = (int)(rnd.getUint32() & 0xFF);
		int		g = (int)(rnd.getUint32() & 0xFF);
		int		b = (int)(rnd.getUint32() & 0xFF);
		int		a = m_testAlpha ? (int)(rnd.getUint32() & 0xFF) : 0xFF;
		RGBA	clearCol(r, g, b, a);
		gl.clearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, float(a)/255.0f);

		// Mask.
		deUint8	clearMask;
		if (!m_testColorMasks || (clearNdx == 0 && m_firstClearFull))
			clearMask = 0xF;
		else
			clearMask = (rnd.getUint32() & 0xF);
		gl.colorMask((clearMask&0x1) != 0, (clearMask&0x2) != 0, (clearMask&0x4) != 0, (clearMask&0x8) != 0);

		// Clear & store op.
		gl.clear(GL_COLOR_BUFFER_BIT);
		clearOps.push_back(ClearInfo(tcu::IVec4(clearX, clearY, clearWidth, clearHeight), clearMask, clearCol));

		// Let watchdog know we're alive.
		m_testCtx.touchWatchdog();
	}

	// Compute reference image.
	{
		for (int y = 0; y < targetHeight; y++)
		{
			std::vector<ClearInfo>	scanlineClearOps;

			// Find all rectangles affecting this scanline.
			for (int opNdx = 0; opNdx < (int)clearOps.size(); opNdx++)
			{
				ClearInfo& op = clearOps[opNdx];
				if (de::inBounds(y, op.m_rect.y(), op.m_rect.y()+op.m_rect.w()))
					scanlineClearOps.push_back(op);
			}

			// Compute reference for scanline.
			int x = 0;
			while (x < targetWidth)
			{
				tcu::RGBA	spanColor;
				deUint8		spanKnownMask	= 0;
				int			spanLength		= (targetWidth - x);

				for (int opNdx = (int)scanlineClearOps.size() - 1; opNdx >= 0; opNdx--)
				{
					const ClearInfo& op = scanlineClearOps[opNdx];

					if (de::inBounds(x, op.m_rect.x(), op.m_rect.x()+op.m_rect.z()) &&
						de::inBounds(y, op.m_rect.y(), op.m_rect.y()+op.m_rect.w()))
					{
						// Compute span length until end of given rectangle.
						spanLength = deMin32(spanLength, op.m_rect.x() + op.m_rect.z() - x);

						tcu::RGBA	clearCol	= op.m_color;
						deUint8		clearMask	= op.m_colorMask;
						if ((clearMask & 0x1) && !(spanKnownMask & 0x1)) spanColor.setRed(clearCol.getRed());
						if ((clearMask & 0x2) && !(spanKnownMask & 0x2)) spanColor.setGreen(clearCol.getGreen());
						if ((clearMask & 0x4) && !(spanKnownMask & 0x4)) spanColor.setBlue(clearCol.getBlue());
						if ((clearMask & 0x8) && !(spanKnownMask & 0x8)) spanColor.setAlpha(clearCol.getAlpha());
						spanKnownMask |= clearMask;

						// Break if have all colors.
						if (spanKnownMask == 0xF)
							break;
					}
					else if (op.m_rect.x() > x)
						spanLength = deMin32(spanLength, op.m_rect.x() - x);
				}

				// Set reference alpha channel to 0xFF, if no alpha in target.
				if (pixelFormat.alphaBits == 0)
					spanColor.setAlpha(0xFF);

				// Fill the span.
				for (int ndx = 0; ndx < spanLength; ndx++)
				{
					refImage.setPixel(x + ndx, y, spanColor);
					pixelKnownChannelMask[y*targetWidth + x + ndx] |= spanKnownMask;
				}

				x += spanLength;
			}
		}
	}

	glu::readPixels(m_context.getRenderContext(), 0, 0, resImage.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels");

	// Compute difference image.
	RGBA colorThreshold = pixelFormat.getColorThreshold();
	RGBA matchColor(0, 255, 0, 255);
	RGBA diffColor(255, 0, 0, 255);
	RGBA maxDiff(0, 0, 0, 0);
	bool isImageOk = true;

	if (gl.isEnabled(GL_DITHER))
	{
		colorThreshold.setRed(colorThreshold.getRed() + 1);
		colorThreshold.setGreen(colorThreshold.getGreen() + 1);
		colorThreshold.setBlue(colorThreshold.getBlue() + 1);
		colorThreshold.setAlpha(colorThreshold.getAlpha() + 1);
	}

	for (int y = 0; y < targetHeight; y++)
	for (int x = 0; x < targetWidth; x++)
	{
		int			offset		= (y*targetWidth + x);
		RGBA		refRGBA		= refImage.getPixel(x, y);
		RGBA		resRGBA		= resImage.getPixel(x, y);
		deUint8		colMask		= pixelKnownChannelMask[offset];
		RGBA		diff		= computeAbsDiffMasked(refRGBA, resRGBA, colMask);
		bool		isPixelOk	= diff.isBelowThreshold(colorThreshold);

		diffImage.setPixel(x, y, isPixelOk ? matchColor : diffColor);

		isImageOk	= isImageOk && isPixelOk;
		maxDiff		= max(maxDiff, diff);
	}

	if (isImageOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		m_testCtx.getLog() << tcu::TestLog::Message << "Image comparison failed, max diff = " << maxDiff << ", threshold = " << colorThreshold << tcu::TestLog::EndMessage;

		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::Image("Reference",	"Reference image",			refImage)
			<< TestLog::Image("DiffMask",	"Failing pixels",			diffImage)
			<< TestLog::EndImageSet;
		return TestCase::STOP;
	}

	bool isFinal = (++m_curIter == m_numIters);

	// On final frame, dump images.
	if (isFinal)
	{
		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::EndImageSet;
	}

	return isFinal ? TestCase::STOP : TestCase::CONTINUE;
}